

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::EndResultVerifier::operator()
          (EndResultVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  ChannelType CVar3;
  AtomicOperation AVar4;
  int iVar5;
  long *plVar6;
  char *__s;
  undefined8 *puVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  ConstPixelBufferAccess *pCVar10;
  ulong uVar11;
  void *__buf;
  long lVar12;
  Vector<int,_3> (*arr) [5];
  int (*arr_00) [5];
  int (*arr_01) [5];
  int iVar13;
  int iVar14;
  ios_base *this_00;
  int z;
  int iVar15;
  int y;
  bool bVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  int atomicArgs [5];
  IVec3 invocationGlobalIDs [5];
  ostringstream s;
  allocator<char> local_729;
  ConstPixelBufferAccess *local_728;
  float local_71c;
  string local_718;
  TestLog *local_6f8;
  int local_6ec;
  int local_6e8;
  int local_6e4;
  EndResultVerifier *local_6e0;
  long *local_6d8 [2];
  long local_6c8 [2];
  Functional local_6b8 [32];
  string local_698;
  undefined8 uStack_678;
  undefined4 uStack_670;
  undefined4 local_66c;
  undefined4 uStack_668;
  undefined8 uStack_664;
  string local_658;
  Vector<int,_2> local_638;
  undefined1 local_630 [8];
  _func_int **local_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620 [6];
  ios_base local_5c0 [8];
  ios_base local_5b8 [264];
  undefined1 local_4b0 [112];
  ios_base local_440 [8];
  ios_base local_438 [264];
  undefined1 local_330 [8];
  _func_int **local_328;
  TestLog local_320 [13];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [264];
  
  CVar3 = (resultSlice->m_format).type;
  if ((0x21 < (ulong)CVar3) || (bVar16 = true, (0x2c0000000U >> ((ulong)CVar3 & 0x3f) & 1) == 0)) {
    bVar16 = CVar3 - SIGNED_INT8 < 3;
  }
  iVar5 = (resultSlice->m_size).m_data[0];
  local_6e4 = (resultSlice->m_size).m_data[1];
  local_728 = resultSlice;
  local_6f8 = log;
  local_6e0 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
  std::ostream::operator<<((ostringstream *)local_4b0,sliceOrFaceNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
  std::ios_base::~ios_base(local_440);
  plVar6 = (long *)std::__cxx11::string::replace((ulong)local_330,0,(char *)0x0,0x1c59808);
  paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 == paVar8) {
    local_620[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_620[0]._8_8_ = plVar6[3];
    local_630 = (undefined1  [8])local_620;
  }
  else {
    local_620[0]._0_8_ = paVar8->_M_allocated_capacity;
    local_630 = (undefined1  [8])*plVar6;
  }
  local_628 = (_func_int **)plVar6[1];
  *plVar6 = (long)paVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_6e0->m_imageType == TEXTURETYPE_CUBE) {
    __s = glu::getCubeMapFaceName
                    ((&DAT_01c58824)
                     [(int)(&Functional::(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces
                           )[sliceOrFaceNdx]]);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_6d8,__s,&local_729);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)local_6d8,0,(char *)0x0,0x1cc1766);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b0);
    std::ostream::operator<<(local_4b0,sliceOrFaceNdx);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b0);
    std::ios_base::~ios_base(local_440);
    puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)local_6d8,0,(char *)0x0,0x1c59337);
  }
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  psVar9 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_718.field_2._M_allocated_capacity = *psVar9;
    local_718.field_2._8_8_ = puVar7[3];
  }
  else {
    local_718.field_2._M_allocated_capacity = *psVar9;
    local_718._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_718._M_string_length = puVar7[1];
  *puVar7 = psVar9;
  puVar7[1] = 0;
  *(undefined1 *)psVar9 = 0;
  plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_718,0,(char *)0x0,0x1c59813);
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_698.field_2._M_allocated_capacity = *psVar9;
    local_698.field_2._8_8_ = plVar6[3];
    local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  }
  else {
    local_698.field_2._M_allocated_capacity = *psVar9;
    local_698._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_698._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pCVar10 = local_728;
  tcu::LogImage::LogImage
            ((LogImage *)local_1b0,(string *)local_630,&local_698,local_728,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1b0,(int)local_6f8,__buf,(size_t)pCVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_p != local_180) {
    operator_delete(local_190._M_p,local_180[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,local_1a0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  if (local_6d8[0] != local_6c8) {
    operator_delete(local_6d8[0],local_6c8[0] + 1);
  }
  if (local_630 != (undefined1  [8])local_620) {
    operator_delete((void *)local_630,(ulong)(local_620[0]._M_allocated_capacity + 1));
  }
  if (local_330 != (undefined1  [8])local_320) {
    operator_delete((void *)local_330,(ulong)((long)&(local_320[0].m_log)->flags + 1));
  }
  iVar15 = (local_728->m_size).m_data[1];
  if (0 < iVar15) {
    local_6e8 = iVar5 * sliceOrFaceNdx * 5;
    local_6ec = sliceOrFaceNdx * sliceOrFaceNdx;
    iVar5 = (local_728->m_size).m_data[0];
    z = 0;
    do {
      if (0 < iVar5) {
        iVar15 = z * z + local_6ec;
        y = 0;
        do {
          pCVar10 = local_728;
          if (bVar16) {
            tcu::ConstPixelBufferAccess::getPixelInt
                      ((ConstPixelBufferAccess *)local_4b0,(int)local_728,y,z);
          }
          else {
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_4b0,(int)local_728,y,z);
          }
          uStack_668 = 0;
          uStack_664 = 0;
          uStack_678 = 0;
          uStack_670 = 0;
          local_66c = 0;
          local_698.field_2._M_allocated_capacity = 0;
          local_698.field_2._8_8_ = 0;
          local_698._M_dataplus._M_p = (pointer)0x0;
          local_698._M_string_length = 0;
          iVar5 = (pCVar10->m_size).m_data[0];
          AVar4 = local_6e0->m_operation;
          lVar12 = 0;
          do {
            while( true ) {
              iVar13 = iVar5 * (int)lVar12 + y;
              *(int *)((long)&local_698._M_dataplus + lVar12 * 0xc) = iVar13;
              *(int *)((long)&local_698._M_dataplus + lVar12 * 0xc + 4) = z;
              *(int *)((long)&local_698._M_string_length + lVar12 * 0xc) = sliceOrFaceNdx;
              if (ATOMIC_OPERATION_XOR < AVar4) break;
              iVar14 = iVar13 * iVar13 + iVar15;
LAB_01486ff5:
              *(int *)(local_6b8 + lVar12 * 4) = iVar14;
              lVar12 = lVar12 + 1;
              if (lVar12 == 5) {
                if (AVar4 < ATOMIC_OPERATION_EXCHANGE) {
                  fVar18 = *(float *)(&DAT_01c5880c + (ulong)AVar4 * 4);
                  lVar12 = 0;
                  do {
                    if (AVar4 < ATOMIC_OPERATION_COMP_SWAP) {
                      fVar19 = *(float *)(local_6b8 + lVar12 * 4);
                      switch((ulong)AVar4) {
                      case 0:
                        fVar18 = (float)((int)fVar18 + (int)fVar19);
                        break;
                      case 1:
                        if ((int)fVar19 <= (int)fVar18) {
                          fVar18 = fVar19;
                        }
                        break;
                      case 2:
                        if ((int)fVar18 <= (int)fVar19) {
                          fVar18 = fVar19;
                        }
                        break;
                      case 3:
                        fVar18 = (float)((uint)fVar18 & (uint)fVar19);
                        break;
                      case 4:
                        fVar18 = (float)((uint)fVar18 | (uint)fVar19);
                        break;
                      case 5:
                        fVar18 = (float)((uint)fVar18 ^ (uint)fVar19);
                        break;
                      case 6:
                        fVar18 = fVar19;
                      }
                    }
                    else {
                      fVar18 = -NAN;
                    }
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 5);
                  if ((float)local_4b0._0_4_ != fVar18) {
                    local_330 = (undefined1  [8])local_6f8;
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_328,"// Failure: end result at pixel ",0x20);
                    local_638.m_data[0] = y;
                    local_638.m_data[1] = z;
                    tcu::operator<<((ostream *)&local_328,&local_638);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_328," of current layer is ",0x15);
                    std::ostream::operator<<((ostringstream *)&local_328,local_4b0._0_4_);
                    local_630 = (undefined1  [8])
                                tcu::MessageBuilder::operator<<
                                          ((MessageBuilder *)local_330,
                                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_628);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_628,
                               "// Note: relevant shader invocation global IDs are ",0x33);
                    arrayStr<tcu::Vector<int,3>,5>(&local_718,(Functional *)&local_698,arr);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_628,local_718._M_dataplus._M_p,
                               local_718._M_string_length);
                    local_1b0._0_8_ =
                         tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)local_630,
                                    (EndMessageToken *)&tcu::TestLog::EndMessage);
                    poVar1 = (ostringstream *)(local_1b0 + 8);
                    std::__cxx11::ostringstream::ostringstream(poVar1);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar1,"// Note: data expression values for the IDs are ",
                               0x30);
                    arrayStr<int,5>(&local_658,local_6b8,arr_00);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar1,local_658._M_dataplus._M_p,
                               local_658._M_string_length);
                    local_4b0._0_8_ =
                         tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)local_1b0,
                                    (EndMessageToken *)&tcu::TestLog::EndMessage);
                    poVar2 = (ostringstream *)(local_4b0 + 8);
                    std::__cxx11::ostringstream::ostringstream(poVar2);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)poVar2,"// Note: reference value is ",0x1c);
                    std::ostream::operator<<(poVar2,(int)fVar18);
                    tcu::MessageBuilder::operator<<
                              ((MessageBuilder *)local_4b0,
                               (EndMessageToken *)&tcu::TestLog::EndMessage);
                    std::__cxx11::ostringstream::~ostringstream(poVar2);
                    std::ios_base::~ios_base(local_438);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_658._M_dataplus._M_p != &local_658.field_2) {
                      operator_delete(local_658._M_dataplus._M_p,
                                      local_658.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream(poVar1);
                    std::ios_base::~ios_base(local_138);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_718._M_dataplus._M_p != &local_718.field_2) {
                      operator_delete(local_718._M_dataplus._M_p,
                                      local_718.field_2._M_allocated_capacity + 1);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_628);
                    std::ios_base::~ios_base(local_5b8);
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
                    this_00 = local_2b8;
                    goto LAB_01487545;
                  }
                  goto LAB_014870e9;
                }
                if (AVar4 != ATOMIC_OPERATION_EXCHANGE) goto LAB_014870e9;
                goto LAB_01487091;
              }
            }
            iVar14 = -1;
            if (AVar4 != ATOMIC_OPERATION_EXCHANGE) goto LAB_01486ff5;
            *(int *)(local_6b8 + lVar12 * 4) = (iVar13 + local_6e8) * local_6e4 + z;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 5);
LAB_01487091:
          local_71c = (float)local_4b0._0_4_;
          uVar11 = 0;
          do {
            if (bVar16) {
              bVar17 = (float)local_4b0._0_4_ == *(float *)(local_6b8 + uVar11 * 4);
            }
            else {
              fVar19 = (float)local_4b0._0_4_ - (float)(int)*(float *)(local_6b8 + uVar11 * 4);
              fVar18 = -fVar19;
              if (-fVar19 <= fVar19) {
                fVar18 = fVar19;
              }
              bVar17 = fVar18 <= 0.01;
            }
          } while ((uVar11 < 4) && (uVar11 = uVar11 + 1, !bVar17));
          if (!bVar17) {
            poVar1 = (ostringstream *)(local_1b0 + 8);
            local_1b0._0_8_ = local_6f8;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"// Failure: invalid value at pixel ",0x23);
            local_718._M_dataplus._M_p._4_4_ = z;
            local_718._M_dataplus._M_p._0_4_ = y;
            tcu::operator<<((ostream *)poVar1,(Vector<int,_2> *)&local_718);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,": got ",6);
            if (bVar16) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
              std::ostream::operator<<(local_630,local_4b0._0_4_);
              std::__cxx11::stringbuf::str();
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_630);
              std::ostream::_M_insert<double>((double)local_71c);
              std::__cxx11::stringbuf::str();
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_630);
            std::ios_base::~ios_base(local_5c0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,(char *)local_330,(long)local_328);
            local_4b0._0_8_ =
                 tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
            poVar2 = (ostringstream *)(local_4b0 + 8);
            std::__cxx11::ostringstream::ostringstream(poVar2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,"// Note: expected one of ",0x19);
            arrayStr<int,5>((string *)local_630,local_6b8,arr_01);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar2,(char *)local_630,(long)local_628);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
            if (local_630 != (undefined1  [8])local_620) {
              operator_delete((void *)local_630,(ulong)(local_620[0]._M_allocated_capacity + 1));
            }
            std::__cxx11::ostringstream::~ostringstream(poVar2);
            std::ios_base::~ios_base(local_438);
            if (local_330 != (undefined1  [8])local_320) {
              operator_delete((void *)local_330,(ulong)((long)&(local_320[0].m_log)->flags + 1));
            }
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            this_00 = local_138;
LAB_01487545:
            std::ios_base::~ios_base(this_00);
            return false;
          }
LAB_014870e9:
          y = y + 1;
        } while (y < iVar5);
        iVar15 = (local_728->m_size).m_data[1];
      }
      z = z + 1;
    } while (z < iVar15);
  }
  return true;
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool		isIntegerFormat		= isFormatTypeInteger(resultSlice.getFormat().type);
		const IVec2		dispatchSizeXY		(NUM_INVOCATIONS_PER_PIXEL*resultSlice.getWidth(), resultSlice.getHeight());

		log << TestLog::Image("EndResults" + toString(sliceOrFaceNdx),
							  "Result Values, " + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																				   : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < resultSlice.getWidth(); x++)
		{
			union
			{
				int		i;
				float	f;
			} result;

			if (isIntegerFormat)
				result.i = resultSlice.getPixelInt(x, y).x();
			else
				result.f = resultSlice.getPixel(x, y).x();

			// Compute the arguments that were given to the atomic function in the invocations that contribute to this pixel.

			IVec3	invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			int		atomicArgs[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec3 gid(x + i*resultSlice.getWidth(), y, sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				atomicArgs[i]			= getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
			}

			if (isOrderIndependentAtomicOperation(m_operation))
			{
				// Just accumulate the atomic args (and the initial value) according to the operation, and compare.

				DE_ASSERT(isIntegerFormat);

				int reference = getOperationInitialValue(m_operation);

				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
					reference = computeBinaryAtomicOperationResult(m_operation, reference, atomicArgs[i]);

				if (result.i != reference)
				{
					log << TestLog::Message << "// Failure: end result at pixel " << IVec2(x, y) << " of current layer is " << result.i << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: data expression values for the IDs are " << arrayStr(atomicArgs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: reference value is " << reference << TestLog::EndMessage;
					return false;
				}
			}
			else if (m_operation == ATOMIC_OPERATION_EXCHANGE)
			{
				// Check that the end result equals one of the atomic args.

				bool matchFound = false;

				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL && !matchFound; i++)
					matchFound = isIntegerFormat ? result.i == atomicArgs[i]
												 : de::abs(result.f - (float)atomicArgs[i]) <= 0.01f;

				if (!matchFound)
				{
					log << TestLog::Message << "// Failure: invalid value at pixel " << IVec2(x, y) << ": got " << (isIntegerFormat ? toString(result.i) : toString(result.f)) << TestLog::EndMessage
											<< TestLog::Message << "// Note: expected one of " << arrayStr(atomicArgs) << TestLog::EndMessage;

					return false;
				}
			}
			else
				DE_ASSERT(false);
		}

		return true;
	}